

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imleInline.hpp
# Opt level: O0

void __thiscall IMLE<1,_1,_FastLinearExpert>::update(IMLE<1,_1,_FastLinearExpert> *this,Z *z,X *x)

{
  bool bVar1;
  size_type sVar2;
  IMLE<1,_1,_FastLinearExpert> *in_RDI;
  Scal SVar3;
  X *unaff_retaddr;
  Z *in_stack_00000008;
  FastLinearExpert<1,_1> *in_stack_00000010;
  iterator it;
  Scal sum_zx;
  X *in_stack_00000340;
  Z *in_stack_00000348;
  IMLE<1,_1,_FastLinearExpert> *in_stack_00000350;
  vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
  *in_stack_fffffffffffffe08;
  __normal_iterator<FastLinearExpert<1,_1>_*,_std::vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>_>
  *in_stack_fffffffffffffe10;
  Experts *this_00;
  LinearExpert<1,_1> *in_stack_fffffffffffffe20;
  X *in_stack_fffffffffffffea0;
  Z *in_stack_fffffffffffffea8;
  LinearExpert<1,_1> *in_stack_fffffffffffffeb0;
  __normal_iterator<FastLinearExpert<1,_1>_*,_std::vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>_>
  local_28;
  double local_20;
  IMLE<1,_1,_FastLinearExpert> *_mixture;
  
  local_20 = 0.0;
  _mixture = in_RDI;
  local_28._M_current =
       (FastLinearExpert<1,_1> *)
       std::
       vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
       ::begin(in_stack_fffffffffffffe08);
  while( true ) {
    std::
    vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>::
    end(in_stack_fffffffffffffe08);
    bVar1 = __gnu_cxx::operator<
                      (in_stack_fffffffffffffe10,
                       (__normal_iterator<FastLinearExpert<1,_1>_*,_std::vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>_>
                        *)in_stack_fffffffffffffe08);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<FastLinearExpert<1,_1>_*,_std::vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>_>
    ::operator->(&local_28);
    SVar3 = LinearExpert<1,_1>::queryZXandH
                      (in_stack_fffffffffffffe20,(Z *)in_RDI,(X *)in_stack_fffffffffffffe10);
    local_20 = SVar3 + local_20;
    __gnu_cxx::
    __normal_iterator<FastLinearExpert<1,_1>_*,_std::vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>_>
    ::operator++((__normal_iterator<FastLinearExpert<1,_1>_*,_std::vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>_>
                  *)in_RDI,(int)((ulong)in_stack_fffffffffffffe10 >> 0x20));
  }
  if ((local_20 <
       (((Z *)&in_RDI->pNoiseModelZX)->super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>)
       .m_storage.m_data.array[0] / (double)in_RDI->M) || (in_RDI->M == 0)) {
    if (0 < in_RDI->noise_to_go) {
      in_RDI->noise_to_go = in_RDI->noise_to_go + -1;
      return;
    }
    this_00 = &in_RDI->experts;
    FastLinearExpert<1,_1>::FastLinearExpert
              (in_stack_00000010,in_stack_00000008,unaff_retaddr,_mixture);
    std::
    vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>::
    push_back((vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
               *)in_stack_fffffffffffffe20,(value_type *)in_RDI);
    std::
    vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>::
    back(&this_00->
          super_vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
        );
    LinearExpert<1,_1>::queryH
              (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,in_stack_fffffffffffffea0);
    sVar2 = std::
            vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
            ::size(&(in_RDI->experts).
                    super_vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
                  );
    in_RDI->M = (int)sVar2;
  }
  EM(in_stack_00000350,in_stack_00000348,in_stack_00000340);
  in_RDI->noise_to_go =
       *(undefined4 *)
        (((LinearExpert<1,_1> *)&in_RDI->param)->Sx).
        super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.m_storage.m_data.array;
  return;
}

Assistant:

IMLE_CLASS_TEMPLATE
void IMLE_base::update(Z const &z, X const &x)
{
#ifdef IMLE_NO_TEMPLATES
    // Check dimensions
    if( z.size() != d || x.size() != D)
    {
        message("IMLE::update: sample point dimensions do not match!!");
        return;
    }
#endif

    // Query experts
    Scal sum_zx = 0.0;
    for(IMLE_TYPENAME Experts::iterator it=experts.begin(); it < experts.end(); it++)
        sum_zx += it->queryZXandH(z,x);

    // Create new expert?
    if( sum_zx < pNoiseModelZX / M || M == 0 )
	{
	    if( noise_to_go > 0)
	    {
	        noise_to_go--;
            return;
	    }

        // Create new linear expert
#ifdef IMLE_NO_TEMPLATES
        experts.push_back( Expert(d,D,z,x,this) );
#else
        experts.push_back( Expert(z,x,this) );
#endif
        experts.back().queryH(z,x);
        M = experts.size();
	}

    EM(z,x);

	noise_to_go = param.nOutliers;
}